

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

void __thiscall
Context<true>::PushNamespace(Context<true> *this,char *ns,BaseState<true> *return_state)

{
  vw *pvVar1;
  substring sVar2;
  Namespace<true> n;
  allocator local_79;
  char *local_78;
  long local_70;
  value_type local_58;
  
  local_58.feature_group = *ns;
  pvVar1 = this->all;
  std::__cxx11::string::string((string *)&local_78,ns,&local_79);
  sVar2.end = local_78 + local_70;
  sVar2.begin = local_78;
  local_58.namespace_hash = (*pvVar1->p->hasher)(sVar2,(ulong)pvVar1->hash_seed);
  std::__cxx11::string::~string((string *)&local_78);
  local_58.ftrs = (this->ex->super_example_predict).feature_space + *ns;
  local_58.feature_count = 0;
  local_58.return_state = return_state;
  local_58.name = ns;
  std::vector<Namespace<true>,_std::allocator<Namespace<true>_>_>::push_back
            (&this->namespace_path,&local_58);
  return;
}

Assistant:

void PushNamespace(const char* ns, BaseState<audit>* return_state)
  {
    Namespace<audit> n;
    n.feature_group = ns[0];
    n.namespace_hash = VW::hash_space(*all, ns);
    n.ftrs = ex->feature_space + ns[0];
    n.feature_count = 0;
    n.return_state = return_state;

    n.name = ns;

    namespace_path.push_back(n);
  }